

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::ungrabKeyboard
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool itemIsDying)

{
  qsizetype *pqVar1;
  long lVar2;
  QGraphicsItem **ppQVar3;
  QGraphicsItem *item_00;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->keyboardGrabberItems).d.size;
  if (0 < lVar2) {
    lVar5 = lVar2 * 8;
    do {
      lVar4 = lVar5;
      lVar5 = lVar4;
      if (lVar4 == 0) goto LAB_0060e7e8;
      lVar5 = lVar4 + -8;
    } while (*(QGraphicsItem **)((long)(this->keyboardGrabberItems).d.ptr + lVar4 + -8) != item);
    lVar5 = lVar4 + -8 >> 3;
LAB_0060e7e8:
    if (lVar4 != 0) goto LAB_0060e7f4;
  }
  lVar5 = -1;
LAB_0060e7f4:
  if ((int)lVar5 == -1) {
    ungrabKeyboard();
  }
  else {
    ppQVar3 = (this->keyboardGrabberItems).d.ptr;
    if (ppQVar3[lVar2 + -1] != item) {
      ungrabKeyboard(this,*(QGraphicsItem **)
                           ((long)ppQVar3 + ((lVar5 << 0x20) + 0x100000000 >> 0x1d)),itemIsDying);
    }
    if (itemIsDying) {
      QList<QGraphicsItem_*>::end(&this->keyboardGrabberItems);
      pqVar1 = &(this->keyboardGrabberItems).d.size;
      *pqVar1 = *pqVar1 + -1;
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_48,UngrabKeyboard);
      sendEvent(this,item,(QEvent *)&local_48);
      QEvent::~QEvent((QEvent *)&local_48);
      QList<QGraphicsItem_*>::end(&this->keyboardGrabberItems);
      lVar2 = (this->keyboardGrabberItems).d.size;
      lVar5 = lVar2 + -1;
      (this->keyboardGrabberItems).d.size = lVar5;
      if (lVar5 != 0) {
        item_00 = (this->keyboardGrabberItems).d.ptr[lVar2 + -2];
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_48,GrabKeyboard);
        sendEvent(this,item_00,(QEvent *)&local_48);
        QEvent::~QEvent((QEvent *)&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::ungrabKeyboard(QGraphicsItem *item, bool itemIsDying)
{
    int index = keyboardGrabberItems.lastIndexOf(item);
    if (index == -1) {
        qWarning("QGraphicsItem::ungrabKeyboard: not a keyboard grabber");
        return;
    }
    if (item != keyboardGrabberItems.constLast()) {
        // Recursively ungrab the topmost keyboard grabber until we reach this
        // item to ensure state consistency.
        ungrabKeyboard(keyboardGrabberItems.at(index + 1), itemIsDying);
    }

    // Send notification about keyboard ungrab.
    if (!itemIsDying) {
        QEvent event(QEvent::UngrabKeyboard);
        sendEvent(item, &event);
    }

    // Remove the item from the list of grabbers.
    keyboardGrabberItems.takeLast();

    // Send notification about mouse regrab.
    if (!itemIsDying && !keyboardGrabberItems.isEmpty()) {
        QGraphicsItem *last = keyboardGrabberItems.constLast();
        QEvent event(QEvent::GrabKeyboard);
        sendEvent(last, &event);
    }
}